

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestSuite::AddTestInfo(TestSuite *this,TestInfo *test_info)

{
  pointer *pppTVar1;
  iterator __position;
  iterator __position_00;
  TestInfo *local_20;
  TestInfo *test_info_local;
  
  __position._M_current =
       (this->test_info_list_).
       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = test_info;
  if (__position._M_current ==
      (this->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>::
    _M_realloc_insert<testing::TestInfo*const&>
              ((vector<testing::TestInfo*,std::allocator<testing::TestInfo*>> *)
               &this->test_info_list_,__position,&local_20);
  }
  else {
    *__position._M_current = test_info;
    pppTVar1 = &(this->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  __position_00._M_current =
       (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  test_info_local._4_4_ =
       (int)((ulong)((long)__position_00._M_current -
                    (long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (__position_00._M_current ==
      (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->test_indices_,__position_00,(int *)((long)&test_info_local + 4));
  }
  else {
    *__position_00._M_current = test_info_local._4_4_;
    (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  return;
}

Assistant:

void TestSuite::AddTestInfo(TestInfo* test_info) {
  test_info_list_.push_back(test_info);
  test_indices_.push_back(static_cast<int>(test_indices_.size()));
}